

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::contextCallbackOverrideCleanup
          (CLIntercept *this,cl_context context,SContextCallbackInfo **pContextCallbackInfo,
          cl_context_properties **pLocalContextProperties)

{
  mapped_type pSVar1;
  mapped_type *ppSVar2;
  cl_context local_28;
  
  local_28 = context;
  if (*pContextCallbackInfo == (SContextCallbackInfo *)0x0 || context == (cl_context)0x0) {
    operator_delete(*pContextCallbackInfo);
    *pContextCallbackInfo = (SContextCallbackInfo *)0x0;
  }
  else {
    std::mutex::lock(&this->m_Mutex);
    ppSVar2 = std::
              map<_cl_context_*,_CLIntercept::SContextCallbackInfo_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SContextCallbackInfo_*>_>_>
              ::operator[](&this->m_ContextCallbackInfoMap,&local_28);
    if (*ppSVar2 != (mapped_type)0x0) {
      operator_delete(*ppSVar2);
    }
    pSVar1 = *pContextCallbackInfo;
    ppSVar2 = std::
              map<_cl_context_*,_CLIntercept::SContextCallbackInfo_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SContextCallbackInfo_*>_>_>
              ::operator[](&this->m_ContextCallbackInfoMap,&local_28);
    *ppSVar2 = pSVar1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  }
  if (*pLocalContextProperties != (cl_context_properties *)0x0) {
    operator_delete(*pLocalContextProperties);
    *pLocalContextProperties = (cl_context_properties *)0x0;
  }
  return;
}

Assistant:

void CLIntercept::contextCallbackOverrideCleanup(
    const cl_context context,
    SContextCallbackInfo*& pContextCallbackInfo,
    cl_context_properties*& pLocalContextProperties )
{
    if( context && pContextCallbackInfo )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        // Check if we already have a context callback info for this context.  If
        // we do, free it.
        SContextCallbackInfo* pOldContextCallbackInfo =
            m_ContextCallbackInfoMap[ context ];
        if( pOldContextCallbackInfo )
        {
            delete pOldContextCallbackInfo;
            pOldContextCallbackInfo = NULL;
        }

        m_ContextCallbackInfoMap[ context ]  = pContextCallbackInfo;
    }
    else
    {
        delete pContextCallbackInfo;
        pContextCallbackInfo = NULL;
    }

    if( pLocalContextProperties )
    {
        delete pLocalContextProperties;
        pLocalContextProperties = NULL;
    }
}